

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pageview.cpp
# Opt level: O1

int __thiscall QtMWidgets::PageView::insertWidget(PageView *this,int index,QWidget *widget)

{
  PageViewPrivate *pPVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int index_00;
  undefined1 auVar7 [16];
  QWidget *local_40 [2];
  
  pPVar1 = (this->d).d;
  lVar2 = (pPVar1->pages).d.size;
  index_00 = (int)lVar2;
  if (lVar2 < index) {
    index = index_00;
  }
  if (-1 < index) {
    index_00 = index;
  }
  local_40[0] = widget;
  QtPrivate::QPodArrayOps<QWidget*>::emplace<QWidget*&>
            ((QPodArrayOps<QWidget*> *)&pPVar1->pages,(long)index_00,local_40);
  pPVar1 = (this->d).d;
  auVar7 = QFrame::frameRect();
  iVar3 = QFrame::frameWidth();
  iVar4 = QFrame::frameWidth();
  iVar5 = QFrame::frameWidth();
  iVar6 = QFrame::frameWidth();
  local_40[1]._0_4_ = auVar7._8_4_ - iVar5;
  local_40[0] = (QWidget *)CONCAT44(auVar7._4_4_ + iVar4,iVar3 + auVar7._0_4_);
  local_40[1]._4_4_ = auVar7._12_4_ - iVar6;
  PageViewPrivate::prepareWidget(pPVar1,widget,(QRect *)local_40);
  QWidget::hide();
  pPVar1 = (this->d).d;
  PageControl::setCount(pPVar1->control,(int)(pPVar1->pages).d.size);
  iVar3 = PageControl::currentIndex(((this->d).d)->control);
  if (iVar3 < 0) {
    PageControl::setCurrentIndex(((this->d).d)->control,index_00);
  }
  return index_00;
}

Assistant:

int
PageView::insertWidget( int index, QWidget * widget )
{
	index = qMin( index, d->pages.count() );

	if( index < 0 )
		index = d->pages.count();

	d->pages.insert( index, widget );

	d->prepareWidget( widget, frameRect().adjusted( frameWidth(), frameWidth(),
		-frameWidth(), -frameWidth() ) );

	widget->hide();

	d->control->setCount( d->pages.count() );

	if ( currentIndex() < 0 )
		setCurrentIndex( index );

	return index;

}